

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatMemory.h
# Opt level: O3

uint xSAT_MemAppend(xSAT_Mem_t *p,int nSize)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  if (nSize < 1) {
    __assert_fail("nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatMemory.h"
                  ,0xa0,"unsigned int xSAT_MemAppend(xSAT_Mem_t *, int)");
  }
  uVar4 = p->nSize;
  uVar1 = p->nCap;
  uVar5 = uVar4 + nSize;
  uVar3 = uVar1;
  if (uVar1 < uVar5) {
    while (uVar3 < uVar5) {
      uVar3 = uVar3 + ((uVar3 >> 3) + (uVar3 >> 1) & 0xfffffffe) + 2;
      p->nCap = uVar3;
      if (uVar3 < uVar1) {
        __assert_fail("p->nCap >= nPrevCap",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatMemory.h"
                      ,0x54,"void xSAT_MemGrow(xSAT_Mem_t *, unsigned int)");
      }
    }
    if (p->pData == (uint *)0x0) {
      puVar2 = (uint *)malloc((ulong)uVar3 << 2);
    }
    else {
      puVar2 = (uint *)realloc(p->pData,(ulong)uVar3 << 2);
      uVar4 = p->nSize;
      uVar5 = nSize + uVar4;
    }
    p->pData = puVar2;
  }
  p->nSize = uVar5;
  if (uVar5 <= uVar4) {
    __assert_fail("p->nSize > nPrevSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatMemory.h"
                  ,0xa4,"unsigned int xSAT_MemAppend(xSAT_Mem_t *, int)");
  }
  return uVar4;
}

Assistant:

static inline unsigned xSAT_MemAppend( xSAT_Mem_t * p, int nSize )
{
    unsigned nPrevSize;
    assert(nSize > 0);
    xSAT_MemGrow( p, p->nSize + nSize );
    nPrevSize = p->nSize;
    p->nSize += nSize;
    assert(p->nSize > nPrevSize);
    return nPrevSize;
}